

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  cmCustomCommandLines *pcVar3;
  cmGeneratorTarget *this_01;
  char *pcVar4;
  allocator local_59;
  string local_58;
  _Alloc_hider local_38;
  
  pcVar3 = cmCustomCommand::GetCommandLines(this->CC);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                      (this->LG,*(string **)
                                 &(pcVar3->
                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ).
                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ._M_impl.super__Vector_impl_data._M_start[c].
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      );
  if ((this_01 != (cmGeneratorTarget *)0x0) &&
     (TVar2 = cmGeneratorTarget::GetType(this_01), TVar2 == EXECUTABLE)) {
    bVar1 = cmGeneratorTarget::IsImported(this_01);
    if (!bVar1) {
      this_00 = this->LG->Makefile;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_CROSSCOMPILING","")
      ;
      bVar1 = cmMakefile::IsOn(this_00,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if (bVar1) goto LAB_0033f215;
    }
    pcVar4 = cmGeneratorTarget::GetLocation(this_01,&this->Config);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_58);
    return __return_storage_ptr__;
  }
LAB_0033f215:
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffffc8,(string *)this->GE)
  ;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_38._M_p,this->LG,&this->Config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,&local_59);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  std::string const& argv0 = this->CC.GetCommandLines()[c][0];
  cmGeneratorTarget* target =
      this->LG->FindGeneratorTargetToUse(argv0);
  if(target && target->GetType() == cmState::EXECUTABLE &&
     (target->IsImported()
      || !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")))
    {
    return target->GetLocation(this->Config);
    }
  return this->GE->Parse(argv0)->Evaluate(this->LG, this->Config);
}